

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

char * start_capture(MatchState *ms,char *s,char *p,int what)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  iVar1 = ms->level;
  lVar2 = (long)iVar1;
  if (lVar2 < 0x20) {
    ms->capture[lVar2].init = s;
    ms->capture[lVar2].len = (long)what;
    ms->level = iVar1 + 1;
    pcVar3 = match(ms,s,p);
    if (pcVar3 == (char *)0x0) {
      ms->level = ms->level + -1;
    }
    return pcVar3;
  }
  lj_err_caller(ms->L,LJ_ERR_STRCAPN);
}

Assistant:

static const char *start_capture(MatchState *ms, const char *s,
				 const char *p, int what)
{
  const char *res;
  int level = ms->level;
  if (level >= LUA_MAXCAPTURES) lj_err_caller(ms->L, LJ_ERR_STRCAPN);
  ms->capture[level].init = s;
  ms->capture[level].len = what;
  ms->level = level+1;
  if ((res=match(ms, s, p)) == NULL)  /* match failed? */
    ms->level--;  /* undo capture */
  return res;
}